

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>::push_back
          (SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true> *this,SimpleKey *Elt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined8 *puVar4;
  SimpleKey *Elt_local;
  SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true> *this_local;
  
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  sVar3 = SmallVectorBase::capacity((SmallVectorBase *)this);
  if (sVar3 <= sVar2) {
    grow(this,0);
  }
  pvVar1 = (this->super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>).
           super_SmallVectorBase.BeginX;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  puVar4 = (undefined8 *)((long)pvVar1 + sVar2 * 0x18);
  *puVar4 = (Elt->Tok).
            super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
            .I.NodePtr;
  puVar4[1] = *(undefined8 *)&Elt->Column;
  puVar4[2] = *(undefined8 *)&Elt->FlowLevel;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar2 + 1);
  return;
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(this->end(), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }